

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wi_stuff.cpp
# Opt level: O3

void WI_initShowNextLoc(void)

{
  uint uVar1;
  FString mapname;
  int iVar2;
  uint lookupText;
  cluster_info_t *pcVar3;
  level_info_t *plVar4;
  cluster_info_t *pcVar5;
  long lVar6;
  AInventory *pAVar7;
  uint cdid;
  int cdtrack;
  char *music;
  char *flat;
  char *text;
  uint textInLump;
  FName *endsequence;
  bool ending;
  FName FStack_2c;
  FName FStack_28;
  FName FStack_24;
  
  if (wbs->next_ep != -1) {
    state = ShowNextLoc;
    acceleratestage = 0;
    cnt = 0x8c;
    WI_LoadBackground(true);
    return;
  }
  state = LeavingIntermission;
  if (deathmatch.Value != 0) {
    FCajunMaster::RemoveAllBots(&bglobal,consoleplayer != Net_Arbitrator);
    G_WorldDone();
    return;
  }
  gameaction = ga_worlddone;
  if ((level.flags._3_1_ & 0x40) == 0) {
    pcVar3 = FindClusterInfo(level.cluster);
    mapname = nextlevel;
    iVar2 = strncmp(nextlevel.Chars,"enDSeQ",6);
    if (iVar2 == 0) {
      lVar6 = strtol(mapname.Chars + 6,(char **)0x0,0x10);
      FStack_24.Index = (int)lVar6;
      if (FStack_24.Index == 0x211) {
        pAVar7 = AActor::FindInventory(players,QuestItemClasses[0x18],false);
        FStack_24.Index = 0x212;
        if (pAVar7 == (AInventory *)0x0) {
          pAVar7 = AActor::FindInventory(players,QuestItemClasses[0x1b],false);
          FStack_24.Index = (pAVar7 == (AInventory *)0x0) + 0x212;
        }
      }
      music = (pcVar3->MessageMusic).Chars;
      iVar2 = pcVar3->musicorder;
      cdtrack = pcVar3->cdtrack;
      cdid = pcVar3->cdid;
      flat = (pcVar3->FinaleFlat).Chars;
      text = (pcVar3->ExitText).Chars;
      uVar1 = pcVar3->flags;
      textInLump = uVar1 & 2;
      lookupText = uVar1 & 0x10;
      endsequence = &FStack_24;
      ending = true;
    }
    else {
      plVar4 = FindLevelInfo(mapname.Chars,true);
      pcVar5 = FindClusterInfo(plVar4->cluster);
      if (pcVar5->cluster == level.cluster) {
        return;
      }
      if (deathmatch.Value != 0) {
        return;
      }
      text = (pcVar5->EnterText).Chars;
      if (*(int *)(text + -0xc) == 0) {
        text = (pcVar3->ExitText).Chars;
        if (*(int *)(text + -0xc) == 0) {
          return;
        }
        flat = (pcVar3->FinaleFlat).Chars;
        music = (pcVar3->MessageMusic).Chars;
        iVar2 = pcVar3->musicorder;
        cdtrack = pcVar3->cdtrack;
        cdid = pcVar5->cdid;
        uVar1 = pcVar3->flags;
        textInLump = uVar1 & 2;
        lookupText = uVar1 & 0x10;
        endsequence = &FStack_2c;
      }
      else {
        flat = (pcVar5->FinaleFlat).Chars;
        music = (pcVar5->MessageMusic).Chars;
        iVar2 = pcVar5->musicorder;
        cdtrack = pcVar5->cdtrack;
        cdid = pcVar5->cdid;
        uVar1 = pcVar5->flags;
        textInLump = uVar1 & 4;
        lookupText = uVar1 & 0x20;
        endsequence = &FStack_28;
      }
      endsequence->Index = 0;
      ending = false;
    }
    F_StartFinale(music,iVar2,cdtrack,cdid,flat,text,textInLump,uVar1 & 8,lookupText,ending,
                  endsequence);
  }
  return;
}

Assistant:

void WI_initShowNextLoc ()
{
	if (wbs->next_ep == -1) 
	{
		// Last map in episode - there is no next location!
		WI_End();
		G_WorldDone();
		return;
	}

	state = ShowNextLoc;
	acceleratestage = 0;
	cnt = SHOWNEXTLOCDELAY * TICRATE;
	WI_LoadBackground(true);
}